

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

void __thiscall
wabt::ExprVisitor::PushCatch(ExprVisitor *this,Expr *expr,Index catch_index,ExprList *expr_list)

{
  iterator local_40;
  State local_2c;
  ExprList *local_28;
  ExprList *expr_list_local;
  Expr *pEStack_18;
  Index catch_index_local;
  Expr *expr_local;
  ExprVisitor *this_local;
  
  local_2c = Catch;
  local_28 = expr_list;
  expr_list_local._4_4_ = catch_index;
  pEStack_18 = expr;
  expr_local = (Expr *)this;
  std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::
  emplace_back<wabt::ExprVisitor::State>(&this->state_stack_,&local_2c);
  std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::emplace_back<wabt::Expr*&>
            ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,
             &stack0xffffffffffffffe8);
  local_40 = intrusive_list<wabt::Expr>::begin(local_28);
  std::
  vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ::emplace_back<wabt::intrusive_list<wabt::Expr>::iterator>(&this->expr_iter_stack_,&local_40);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->catch_index_stack_,
             (uint *)((long)&expr_list_local + 4));
  return;
}

Assistant:

void ExprVisitor::PushCatch(Expr* expr,
                            Index catch_index,
                            ExprList& expr_list) {
  state_stack_.emplace_back(State::Catch);
  expr_stack_.emplace_back(expr);
  expr_iter_stack_.emplace_back(expr_list.begin());
  catch_index_stack_.emplace_back(catch_index);
}